

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *center,float radius,float a_min,float a_max,int num_segments)

{
  ImVector<ImVec2> *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int a_max_sample;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_98;
  ImVec2 local_50;
  float local_48;
  
  if (radius <= 0.0) {
    ImVector<ImVec2>::push_back(&this->_Path,center);
    return;
  }
  if (num_segments < 1) {
    if (radius <= this->_Data->ArcFastRadiusCutoff) {
      fVar4 = (a_min * 48.0) / 6.2831855;
      fVar7 = (a_max * 48.0) / 6.2831855;
      if (a_min <= a_max) {
        fVar4 = ceilf(fVar4);
        iVar1 = (int)fVar4;
        fVar4 = ImFloorSigned(fVar7);
        a_max_sample = (int)fVar4;
        iVar3 = a_max_sample - iVar1;
      }
      else {
        fVar4 = ImFloorSigned(fVar4);
        iVar1 = (int)fVar4;
        fVar4 = ceilf(fVar7);
        a_max_sample = (int)fVar4;
        iVar3 = iVar1 - a_max_sample;
      }
      iVar2 = 0;
      if (0 < iVar3) {
        iVar2 = iVar3;
      }
      fVar7 = ((float)iVar1 * 3.1415927 + (float)iVar1 * 3.1415927) / 48.0 - a_min;
      fVar4 = a_max - ((float)a_max_sample * 3.1415927 + (float)a_max_sample * 3.1415927) / 48.0;
      this_00 = &this->_Path;
      ImVector<ImVec2>::reserve
                (this_00,iVar2 + (this->_Path).Size + (uint)(fVar4 != 0.0) + (uint)(fVar7 != 0.0) +
                         1);
      if ((fVar7 != 0.0) || (NAN(fVar7))) {
        fVar7 = center->x;
        local_48 = cosf(a_min);
        fVar6 = center->y;
        fVar5 = sinf(a_min);
        local_50.y = radius * fVar5 + fVar6;
        local_50.x = radius * local_48 + fVar7;
        ImVector<ImVec2>::push_back(this_00,&local_50);
      }
      if (0 < iVar3) {
        _PathArcToFastEx(this,center,radius,iVar1,a_max_sample,0);
      }
      if ((fVar4 != 0.0) || (NAN(fVar4))) {
        fVar4 = center->x;
        fVar6 = cosf(a_max);
        fVar7 = center->y;
        fVar5 = sinf(a_max);
        local_50.y = radius * fVar5 + fVar7;
        local_50.x = radius * fVar6 + fVar4;
        ImVector<ImVec2>::push_back(this_00,&local_50);
      }
      return;
    }
    local_98 = ABS(a_max - a_min);
    iVar1 = _CalcCircleAutoSegmentCount(this,radius);
    fVar4 = ceilf(((float)iVar1 * local_98) / 6.2831855);
    num_segments = (int)(6.2831855 / local_98);
    if ((int)(6.2831855 / local_98) < (int)fVar4) {
      num_segments = (int)fVar4;
    }
  }
  _PathArcToN(this,center,radius,a_min,a_max,num_segments);
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& center, float radius, float a_min, float a_max, int num_segments)
{
    if (radius <= 0.0f)
    {
        _Path.push_back(center);
        return;
    }

    if (num_segments > 0)
    {
        _PathArcToN(center, radius, a_min, a_max, num_segments);
        return;
    }

    // Automatic segment count
    if (radius <= _Data->ArcFastRadiusCutoff)
    {
        const bool a_is_reverse = a_max < a_min;

        // We are going to use precomputed values for mid samples.
        // Determine first and last sample in lookup table that belong to the arc.
        const float a_min_sample_f = IM_DRAWLIST_ARCFAST_SAMPLE_MAX * a_min / (IM_PI * 2.0f);
        const float a_max_sample_f = IM_DRAWLIST_ARCFAST_SAMPLE_MAX * a_max / (IM_PI * 2.0f);

        const int a_min_sample = a_is_reverse ? (int)ImFloorSigned(a_min_sample_f) : (int)ImCeil(a_min_sample_f);
        const int a_max_sample = a_is_reverse ? (int)ImCeil(a_max_sample_f) : (int)ImFloorSigned(a_max_sample_f);
        const int a_mid_samples = a_is_reverse ? ImMax(a_min_sample - a_max_sample, 0) : ImMax(a_max_sample - a_min_sample, 0);

        const float a_min_segment_angle = a_min_sample * IM_PI * 2.0f / IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        const float a_max_segment_angle = a_max_sample * IM_PI * 2.0f / IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        const bool a_emit_start = (a_min_segment_angle - a_min) != 0.0f;
        const bool a_emit_end = (a_max - a_max_segment_angle) != 0.0f;

        _Path.reserve(_Path.Size + (a_mid_samples + 1 + (a_emit_start ? 1 : 0) + (a_emit_end ? 1 : 0)));
        if (a_emit_start)
            _Path.push_back(ImVec2(center.x + ImCos(a_min) * radius, center.y + ImSin(a_min) * radius));
        if (a_mid_samples > 0)
            _PathArcToFastEx(center, radius, a_min_sample, a_max_sample, 0);
        if (a_emit_end)
            _Path.push_back(ImVec2(center.x + ImCos(a_max) * radius, center.y + ImSin(a_max) * radius));
    }
    else
    {
        const float arc_length = ImAbs(a_max - a_min);
        const int circle_segment_count = _CalcCircleAutoSegmentCount(radius);
        const int arc_segment_count = ImMax((int)ImCeil(circle_segment_count * arc_length / (IM_PI * 2.0f)), (int)(2.0f * IM_PI / arc_length));
        _PathArcToN(center, radius, a_min, a_max, arc_segment_count);
    }
}